

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileperblock_file.cpp
# Opt level: O2

void __thiscall
foxxll::fileperblock_file<foxxll::mmap_file>::lock(fileperblock_file<foxxll::mmap_file> *this)

{
  counting_ptr<foxxll::mmap_file> *this_00;
  void *ptr;
  ufs_file_base *puVar1;
  mmap_file *pmVar2;
  request *prVar3;
  request_ptr r;
  int local_3c;
  undefined1 local_38 [32];
  
  this_00 = &this->lock_file_;
  if ((this->lock_file_).ptr_ == (mmap_file *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_disk_queued_file).field_0x10,"_fpb_lock");
    local_3c = (*(this->super_disk_queued_file)._vptr_disk_queued_file[2])(this);
    tlx::make_counting<foxxll::mmap_file,std::__cxx11::string,int&,int>
              ((tlx *)&r,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (int *)&(this->super_disk_queued_file).field_0x30,&local_3c);
    tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator=
              (this_00,(CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter> *)&r);
    tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::dec_reference
              ((CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter> *)&r);
    std::__cxx11::string::~string((string *)local_38);
    ptr = aligned_alloc<4096ul>(0x1000,0);
    puVar1 = &tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator->
                        (this_00)->super_ufs_file_base;
    ufs_file_base::set_size(puVar1,0x1000);
    pmVar2 = tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator->
                       (this_00);
    local_38._16_8_ = 0;
    local_38._24_8_ = 0;
    local_38._0_8_ = (pointer)0x0;
    local_38._8_8_ = 0;
    disk_queued_file::awrite
              ((disk_queued_file *)&r,&(pmVar2->super_ufs_file_base).field_0x60,(offset_type)ptr,0,
               (completion_handler *)0x1000);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 0x18));
    prVar3 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->(&r);
    (**(code **)(*(long *)(&prVar3->field_0x0 + *(long *)(*(long *)prVar3 + -0x68)) + 0x30))
              (&prVar3->field_0x0 + *(long *)(*(long *)prVar3 + -0x68),1);
    aligned_dealloc<4096ul>(ptr);
    tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(&r);
  }
  puVar1 = &tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator->(this_00)
            ->super_ufs_file_base;
  ufs_file_base::lock(puVar1);
  return;
}

Assistant:

void fileperblock_file<base_file_type>::lock()
{
    if (!lock_file_)
    {
        lock_file_ = tlx::make_counting<base_file_type>(
                filename_prefix_ + "_fpb_lock", mode_, get_queue_id()
            );

        //create lock file and fill it with one page, an empty file cannot be locked
        const int page_size = BlockAlignment;
        void* one_page = aligned_alloc<BlockAlignment>(page_size);
#if FOXXLL_WITH_VALGRIND
        memset(one_page, 0, page_size);
#endif
        lock_file_->set_size(page_size);
        request_ptr r = lock_file_->awrite(one_page, 0, page_size);
        r->wait();
        aligned_dealloc<BlockAlignment>(one_page);
    }
    lock_file_->lock();
}